

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryCompressedTTF
          (ImFontAtlas *this,void *compressed_ttf_data,int compressed_ttf_size,float size_pixels,
          ImFontConfig_conflict *font_cfg_template,ImWchar *glyph_ranges)

{
  uint ttf_size;
  uint uVar1;
  uchar *ttf_data;
  long lVar2;
  ImFont *pIVar3;
  ulong uVar4;
  byte bVar5;
  ushort *puVar6;
  ushort *puVar7;
  uchar *puVar8;
  ImFontConfig_conflict local_b8;
  
  ttf_size = stb_decompress_length((uchar *)compressed_ttf_data);
  ttf_data = (uchar *)ImGui::MemAlloc((ulong)ttf_size);
  uVar1 = *compressed_ttf_data;
  if (((uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18) !=
       0x57bc0000) ||
     (uVar1 = *(uint *)((long)compressed_ttf_data + 4),
     ((uVar1 >> 0x18 != 0 || (uVar1 & 0xff0000) != 0) || (uVar1 & 0xff00) != 0) ||
     (uVar1 & 0xff) != 0)) {
LAB_001ec76a:
    if (font_cfg_template == (ImFontConfig_conflict *)0x0) {
      memset(&local_b8,0,0x88);
      local_b8.OversampleH = L'\x03';
      local_b8.OversampleV = L'\x01';
      local_b8.GlyphMaxAdvanceX = 3.4028235e+38;
      local_b8.RasterizerMultiply = 1.0;
      local_b8.EllipsisChar = 0xffff;
    }
    else {
      memcpy(&local_b8,font_cfg_template,0x88);
      if (local_b8.FontData != (void *)0x0) {
        __assert_fail("font_cfg.FontData == __null",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                      ,0x889,
                      "ImFont *ImFontAtlas::AddFontFromMemoryCompressedTTF(const void *, int, float, const ImFontConfig *, const ImWchar *)"
                     );
      }
    }
    local_b8.FontDataOwnedByAtlas = true;
    pIVar3 = AddFontFromMemoryTTF(this,ttf_data,ttf_size,size_pixels,&local_b8,glyph_ranges);
    return pIVar3;
  }
  uVar1 = stb_decompress_length((uchar *)compressed_ttf_data);
  puVar8 = ttf_data + uVar1;
  puVar6 = (ushort *)((long)compressed_ttf_data + 0x10);
  stb__barrier_in_b = (uchar *)compressed_ttf_data;
  stb__barrier_out_e = puVar8;
  stb__barrier_out_b = ttf_data;
  stb__dout = ttf_data;
  do {
    bVar5 = (byte)*puVar6;
    uVar1 = (uint)bVar5;
    if (bVar5 < 0x20) {
      if (bVar5 < 0x18) {
        if (bVar5 < 0x10) {
          if (bVar5 < 8) {
            if (bVar5 != 4) {
              if (uVar1 == 6) {
                uVar4 = ~((ulong)*(byte *)((long)puVar6 + 3) |
                          (ulong)*(byte *)((long)puVar6 + 1) << 0x10 | (ulong)(byte)puVar6[1] << 8);
                uVar1 = (uint)(byte)puVar6[2];
                goto LAB_001ec5f5;
              }
              if (uVar1 == 7) {
                stb__lit((byte *)((long)puVar6 + 3),
                         (ushort)(*(ushort *)((long)puVar6 + 1) << 8 |
                                 *(ushort *)((long)puVar6 + 1) >> 8) + 1);
                uVar4 = (ulong)(ushort)(*(ushort *)((long)puVar6 + 1) << 8 |
                                       *(ushort *)((long)puVar6 + 1) >> 8);
                lVar2 = 4;
                goto LAB_001ec6ab;
              }
              goto LAB_001ec73e;
            }
            stb__match(stb__dout +
                       ~((ulong)*(byte *)((long)puVar6 + 3) |
                         (ulong)*(byte *)((long)puVar6 + 1) << 0x10 | (ulong)(byte)puVar6[1] << 8),
                       (ushort)(puVar6[2] << 8 | puVar6[2] >> 8) + 1);
            puVar7 = puVar6 + 3;
          }
          else {
            stb__lit((uchar *)(puVar6 + 1),
                     ((uint)bVar5 * 0x100 + (uint)*(byte *)((long)puVar6 + 1)) - 0x7ff);
            uVar4 = (ulong)(ushort)(*puVar6 << 8 | *puVar6 >> 8);
            lVar2 = -0x7fd;
LAB_001ec6ab:
            puVar7 = (ushort *)((long)puVar6 + uVar4 + lVar2);
            if (puVar7 == puVar6) {
              bVar5 = (byte)*puVar6;
LAB_001ec73e:
              if ((bVar5 != 5) || (*(byte *)((long)puVar6 + 1) != 0xfa)) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                              ,0xfed,
                              "unsigned int stb_decompress(unsigned char *, const unsigned char *, unsigned int)"
                             );
              }
              if (stb__dout != puVar8) {
                __assert_fail("stb__dout == output + olen",
                              "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                              ,0xfe7,
                              "unsigned int stb_decompress(unsigned char *, const unsigned char *, unsigned int)"
                             );
              }
              goto LAB_001ec76a;
            }
          }
        }
        else {
          uVar4 = -(ulong)(((uint)*(byte *)((long)puVar6 + 1) * 0x100 +
                           ((uint)(byte)puVar6[1] | (uint)bVar5 << 0x10)) - 0xfffff);
          uVar1 = (uint)(ushort)(*(ushort *)((long)puVar6 + 3) << 8 |
                                *(ushort *)((long)puVar6 + 3) >> 8);
LAB_001ec5f5:
          stb__match(stb__dout + uVar4,uVar1 + 1);
          puVar7 = (ushort *)((long)puVar6 + 5);
        }
      }
      else {
        stb__match(stb__dout +
                   -(ulong)(((uint)*(byte *)((long)puVar6 + 1) * 0x100 +
                            ((uint)(byte)puVar6[1] | (uint)bVar5 << 0x10)) - 0x17ffff),
                   *(byte *)((long)puVar6 + 3) + 1);
        puVar7 = puVar6 + 2;
      }
    }
    else if ((char)bVar5 < '\0') {
      stb__match(stb__dout + ~(ulong)*(byte *)((long)puVar6 + 1),uVar1 - 0x7f);
      puVar7 = puVar6 + 1;
    }
    else {
      if (bVar5 < 0x40) {
        stb__lit((byte *)((long)puVar6 + 1),uVar1 - 0x1f);
        uVar4 = (ulong)(byte)*puVar6;
        lVar2 = -0x1e;
        goto LAB_001ec6ab;
      }
      stb__match(stb__dout +
                 -(ulong)(((uint)*(byte *)((long)puVar6 + 1) + (uint)bVar5 * 0x100) - 0x3fff),
                 (byte)puVar6[1] + 1);
      puVar7 = (ushort *)((long)puVar6 + 3);
    }
    puVar6 = puVar7;
    if (puVar8 < stb__dout) {
      __assert_fail("stb__dout <= output + olen",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                    ,0xff1,
                    "unsigned int stb_decompress(unsigned char *, const unsigned char *, unsigned int)"
                   );
    }
  } while( true );
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryCompressedTTF(const void* compressed_ttf_data, int compressed_ttf_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    const unsigned int buf_decompressed_size = stb_decompress_length((const unsigned char*)compressed_ttf_data);
    unsigned char* buf_decompressed_data = (unsigned char*)IM_ALLOC(buf_decompressed_size);
    stb_decompress(buf_decompressed_data, (const unsigned char*)compressed_ttf_data, (unsigned int)compressed_ttf_size);

    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    font_cfg.FontDataOwnedByAtlas = true;
    return AddFontFromMemoryTTF(buf_decompressed_data, (int)buf_decompressed_size, size_pixels, &font_cfg, glyph_ranges);
}